

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUnitPower(string *str,char *unit,int power,uint64_t flags)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  long lVar4;
  uint64_t in_RCX;
  int in_EDX;
  string *in_RSI;
  bool div;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined4 in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffdc;
  uint __val;
  int power_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  __val = (uint)in_stack_ffffffffffffffdc;
  if (in_EDX != 0) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x739791);
    if (!bVar1) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_stack_ffffffffffffffa0);
      if (*pvVar3 == '/') {
        __val = CONCAT13(1,(int3)__val);
      }
      else {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                           (in_stack_ffffffffffffffa0);
        if (*pvVar3 != '*') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
        }
      }
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (in_EDX != 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
      lVar4 = (long)in_EDX;
      if (lVar4 < 1) {
        lVar4 = -lVar4;
      }
      if (lVar4 < 10) {
        if (in_EDX < 0) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
        }
      }
      else {
        bVar1 = allowLargePowers(in_RCX);
        power_00 = (int)(in_RCX >> 0x20);
        if (bVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
          this = &local_48;
          CLI::std::__cxx11::to_string(__val);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(in_stack_ffffffffffffffb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          std::__cxx11::string::~string(this);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
        }
        else {
          if (in_EDX < 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
            iVar2 = in_EDX + 9;
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
            iVar2 = in_EDX + -9;
          }
          if ((__val & 0x1000000) != 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
          }
          addUnitPower(in_RSI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),power_00,
                       CONCAT44(__val,in_stack_ffffffffffffffd8));
        }
      }
    }
  }
  return;
}

Assistant:

static void addUnitPower(
    std::string& str,
    const char* unit,
    int power,
    std::uint64_t flags)
{
    bool div{false};
    if (power != 0) {
        if (!str.empty()) {
            if (str.back() != '/') {
                if (str.back() != '*') {
                    str.push_back('*');
                }
            } else {
                div = true;
            }
        }

        str.append(unit);
        if (power != 1) {
            str.push_back('^');
            if (std::labs(power) < 10) {
                if (power < 0) {
                    str.push_back('-');
                    str.push_back('0' - power);
                } else {
                    str.push_back('0' + power);
                }
            } else {
                if (allowLargePowers(flags)) {
                    str.push_back('(');
                    str.append(std::to_string(power));
                    str.push_back(')');
                } else {
                    if (power < 0) {
                        str.push_back('-');
                        str.push_back('9');
                        power += 9;
                    } else {
                        str.push_back('9');
                        power -= 9;
                    }
                    if (div) {
                        str.push_back('/');
                    }
                    addUnitPower(str, unit, power, flags);
                }
            }
        }
    }
}